

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void store_delete_random(store *store)

{
  byte bVar1;
  object *obj;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t amt;
  wchar_t wVar4;
  
  if (store->stock_num == 0) {
    __assert_fail("store->stock_num > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x4f1,"void store_delete_random(struct store *)");
  }
  uVar3 = Rand_div((uint)store->stock_num);
  obj = store->stock;
  for (; uVar3 != 0; uVar3 = uVar3 - 1) {
    if (obj == (object *)0x0) {
      __assert_fail("obj",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                    ,0x4f9,"void store_delete_random(struct store *)");
    }
    obj = obj->next;
  }
  bVar1 = obj->number;
  wVar4 = (wchar_t)bVar1;
  amt = (wchar_t)bVar1;
  if (1 < (uint)amt) {
    _Var2 = tval_is_ammo(obj);
    uVar3 = Rand_div(100);
    if (_Var2) {
      if (bVar1 < 10 || (int)uVar3 < 0x32) {
        amt = (wchar_t)obj->number;
        wVar4 = amt;
      }
      else {
        uVar3 = Rand_div(bVar1 / 5);
        amt = uVar3 * 5 + (uint)(byte)(bVar1 + (char)(bVar1 / 5) * -5) + L'\x05';
        wVar4 = (wchar_t)obj->number;
      }
    }
    else {
      amt = L'\x01';
      if (0x31 < (int)uVar3) {
        uVar3 = Rand_div(100);
        if ((int)uVar3 < 0x32) {
          amt = bVar1 + 1 >> 1;
        }
        else {
          amt = (wchar_t)obj->number;
        }
      }
      _Var2 = tval_can_have_charges(obj);
      wVar4 = (wchar_t)obj->number;
      if (_Var2) {
        obj->pval = obj->pval - (short)((amt * obj->pval) / wVar4);
      }
    }
  }
  if (amt <= wVar4) {
    if (obj->artifact != (artifact *)0x0) {
      history_lose_artifact(player,obj->artifact);
    }
    store_delete(store,obj,amt);
    return;
  }
  __assert_fail("num <= obj->number",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                ,0x51b,"void store_delete_random(struct store *)");
}

Assistant:

static void store_delete_random(struct store *store)
{
	int what;
	int num;
	struct object *obj;

	assert(store->stock_num > 0);

	/* Pick a random slot */
	what = randint0(store->stock_num);

	/* Walk through list until we find our item */
	obj = store->stock;
	while (what--) {
		assert(obj);
		obj = obj->next;
	}

	/* Determine how many objects are in the slot */
	num = obj->number;

	/* Deal with stacks */
	if (num > 1) {
		/* Special behaviour for arrows, bolts &tc. */
		if (tval_is_ammo(obj)) {
			/* 50% of the time, destroy the entire stack */
			if (randint0(100) < 50 || num < 10)
				num = obj->number;

			/* 50% of the time, reduce the size to a multiple of 5 */
			else
				num = randint1(num / 5) * 5 + (num % 5);
		} else {
			/* 50% of the time, destroy a single object */
			if (randint0(100) < 50) num = 1;

			/* 25% of the time, destroy half the objects */
			else if (randint0(100) < 50) num = (num + 1) / 2;

			/* 25% of the time, destroy all objects */
			else num = obj->number;

			/* Hack -- decrement the total charges of staves and wands. */
			if (tval_can_have_charges(obj))
				obj->pval -= num * obj->pval / obj->number;
		}
	}

	assert (num <= obj->number);

	if (obj->artifact) {
		history_lose_artifact(player, obj->artifact);
	}

	/* Delete the item, wholly or in part */
	store_delete(store, obj, num);
}